

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int diff(double *sig,int N,int d,double *oup)

{
  double dVar1;
  double *C;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double dVar7;
  
  C = (double *)malloc((long)(int)(d + 1U) << 3);
  deld(d,C);
  if (N - d != 0 && d <= N) {
    dVar1 = *C;
    lVar2 = (long)d;
    pdVar3 = sig + lVar2;
    lVar4 = lVar2;
    do {
      dVar7 = 0.0;
      if (0 < d) {
        lVar5 = -1;
        pdVar6 = C;
        do {
          pdVar6 = pdVar6 + 1;
          dVar7 = dVar7 + pdVar3[lVar5] * *pdVar6;
          lVar5 = lVar5 + -1;
        } while (-lVar5 != (ulong)(d + 1U));
      }
      oup[lVar4 - lVar2] = sig[lVar4] * dVar1 + dVar7;
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (lVar4 != N);
  }
  free(C);
  return N - d;
}

Assistant:

int diff(double *sig, int N, int d, double *oup) {
	int Noup,i,j;
	double *coeff;
	double sum;
	/*
	 * 
	 * diff output = [ X(t) - X(t-1) ] ^ d where X(t) is the
	 * input timeseries of length N
	 * output is of length N - d
	 * 
	 * diff is used to detrend data
	 * 
	 * d=1 typically takes care of linear trend while
	 * d=2 handles quadratic trend
	 */ 
	
	coeff = (double*) malloc(sizeof(double) * (d+1));
	deld(d,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = 1; j < d+1;++j) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}

	free(coeff);
	
	
	return Noup;
}